

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O3

void __thiscall Assimp::FindInstancesProcess::Execute(FindInstancesProcess *this,aiScene *pScene)

{
  aiMesh *paVar1;
  aiMesh *orig;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  aiColor4D *paVar4;
  aiColor4D *paVar5;
  bool bVar6;
  uint n;
  uint uVar7;
  int iVar8;
  Logger *pLVar9;
  void *pvVar10;
  uint *lookup;
  aiMesh **ppaVar11;
  ulong uVar12;
  void *__s2;
  void *__s1;
  ulong uVar13;
  uint real;
  ulong uVar14;
  uint uVar15;
  aiFace *paVar16;
  long lVar17;
  aiVector3D *paVar18;
  ulong uVar19;
  aiVector3D *paVar20;
  aiColor4D *paVar21;
  ulong uVar22;
  uint uVar23;
  ai_real aVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"FindInstancesProcess begin");
  uVar19 = (ulong)pScene->mNumMeshes;
  if (uVar19 != 0) {
    pvVar10 = operator_new__(uVar19 * 8);
    lookup = (uint *)operator_new__(uVar19 << 2);
    ppaVar11 = pScene->mMeshes;
    uVar15 = 0;
    uVar23 = 0;
    do {
      uVar19 = (ulong)uVar23;
      paVar1 = ppaVar11[uVar19];
      if (paVar1 == (aiMesh *)0x0) {
        __assert_fail("nullptr != in",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInstancesProcess.h"
                      ,0x41,"uint64_t Assimp::GetMeshHash(aiMesh *)");
      }
      uVar7 = GetMeshVFormatUnique(paVar1);
      *(ulong *)((long)pvVar10 + uVar19 * 8) =
           CONCAT44(uVar7,paVar1->mPrimitiveTypes << 0x1c ^
                          paVar1->mMaterialIndex << 0xf ^ paVar1->mNumFaces << 4 ^
                          paVar1->mNumBones << 0x10 ^ paVar1->mNumVertices);
      aVar24 = ComputePositionEpsilon(paVar1);
      if (-1 < (int)(uVar23 - 1)) {
        fVar25 = aVar24 * aVar24;
        uVar7 = uVar23 - 1;
LAB_003bd365:
        uVar22 = (ulong)uVar7;
        if (((((*(long *)((long)pvVar10 + uVar19 * 8) == *(long *)((long)pvVar10 + uVar22 * 8)) &&
              (orig = pScene->mMeshes[uVar22], orig != (aiMesh *)0x0)) &&
             (orig->mNumBones == paVar1->mNumBones)) &&
            ((orig->mNumFaces == paVar1->mNumFaces &&
             (uVar13 = (ulong)orig->mNumVertices, orig->mNumVertices == paVar1->mNumVertices)))) &&
           ((orig->mMaterialIndex == paVar1->mMaterialIndex &&
            (orig->mPrimitiveTypes == paVar1->mPrimitiveTypes)))) {
          paVar2 = orig->mVertices;
          if (uVar13 != 0 && paVar2 != (aiVector3D *)0x0) {
            paVar3 = paVar1->mVertices;
            lVar17 = 0;
            do {
              fVar28 = *(float *)((long)&paVar2->x + lVar17) - *(float *)((long)&paVar3->x + lVar17)
              ;
              fVar26 = *(float *)((long)&paVar2->y + lVar17) - *(float *)((long)&paVar3->y + lVar17)
              ;
              fVar27 = *(float *)((long)&paVar2->z + lVar17) - *(float *)((long)&paVar3->z + lVar17)
              ;
              if (fVar25 <= fVar27 * fVar27 + fVar28 * fVar28 + fVar26 * fVar26) goto LAB_003bd810;
              paVar18 = (aiVector3D *)((long)&paVar2[1].x + lVar17);
              lVar17 = lVar17 + 0xc;
            } while (paVar18 != paVar2 + uVar13);
          }
          paVar2 = orig->mNormals;
          if (paVar2 != (aiVector3D *)0x0 && uVar13 != 0) {
            paVar3 = paVar1->mNormals;
            lVar17 = 0;
            do {
              fVar28 = *(float *)((long)&paVar2->x + lVar17) - *(float *)((long)&paVar3->x + lVar17)
              ;
              fVar26 = *(float *)((long)&paVar2->y + lVar17) - *(float *)((long)&paVar3->y + lVar17)
              ;
              fVar27 = *(float *)((long)&paVar2->z + lVar17) - *(float *)((long)&paVar3->z + lVar17)
              ;
              if (fVar25 <= fVar27 * fVar27 + fVar28 * fVar28 + fVar26 * fVar26) goto LAB_003bd810;
              paVar18 = (aiVector3D *)((long)&paVar2[1].x + lVar17);
              lVar17 = lVar17 + 0xc;
            } while (paVar18 != paVar2 + uVar13);
          }
          if (((uVar13 != 0) && (paVar2 = orig->mTangents, paVar2 != (aiVector3D *)0x0)) &&
             (paVar3 = orig->mBitangents, paVar3 != (aiVector3D *)0x0)) {
            paVar18 = paVar1->mTangents;
            lVar17 = 0;
            do {
              fVar28 = *(float *)((long)&paVar2->x + lVar17) -
                       *(float *)((long)&paVar18->x + lVar17);
              fVar26 = *(float *)((long)&paVar2->y + lVar17) -
                       *(float *)((long)&paVar18->y + lVar17);
              fVar27 = *(float *)((long)&paVar2->z + lVar17) -
                       *(float *)((long)&paVar18->z + lVar17);
              if (fVar25 <= fVar27 * fVar27 + fVar28 * fVar28 + fVar26 * fVar26) goto LAB_003bd810;
              paVar20 = (aiVector3D *)((long)&paVar2[1].x + lVar17);
              lVar17 = lVar17 + 0xc;
            } while (paVar20 != paVar2 + uVar13);
            paVar2 = paVar1->mBitangents;
            lVar17 = 0;
            do {
              fVar28 = *(float *)((long)&paVar3->x + lVar17) - *(float *)((long)&paVar2->x + lVar17)
              ;
              fVar26 = *(float *)((long)&paVar3->y + lVar17) - *(float *)((long)&paVar2->y + lVar17)
              ;
              fVar27 = *(float *)((long)&paVar3->z + lVar17) - *(float *)((long)&paVar2->z + lVar17)
              ;
              if (fVar25 <= fVar27 * fVar27 + fVar28 * fVar28 + fVar26 * fVar26) goto LAB_003bd810;
              paVar18 = (aiVector3D *)((long)&paVar3[1].x + lVar17);
              lVar17 = lVar17 + 0xc;
            } while (paVar18 != paVar3 + uVar13);
          }
          uVar12 = 0;
LAB_003bd5a2:
          if (orig->mTextureCoords[uVar12] != (aiVector3D *)0x0) goto code_r0x003bd5aa;
          if (uVar12 == 0) {
            iVar8 = 0;
            uVar14 = 0;
LAB_003bd64a:
            if ((int)uVar14 == iVar8) goto LAB_003bd652;
            goto LAB_003bd810;
          }
          goto LAB_003bd5c3;
        }
        goto LAB_003bd810;
      }
LAB_003bd81e:
      ppaVar11 = pScene->mMeshes;
      if (ppaVar11[uVar19] != (aiMesh *)0x0) {
        lookup[uVar19] = uVar15;
        uVar15 = uVar15 + 1;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < pScene->mNumMeshes);
    if (uVar15 == 0) {
      __assert_fail("0 != numMeshesOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInstancesProcess.cpp"
                    ,0x100,"virtual void Assimp::FindInstancesProcess::Execute(aiScene *)");
    }
    if (uVar15 == pScene->mNumMeshes) {
      pLVar9 = DefaultLogger::get();
      Logger::debug(pLVar9,"FindInstancesProcess finished. No instanced meshes found");
    }
    else {
      uVar23 = 0;
      uVar7 = 0;
      do {
        paVar1 = pScene->mMeshes[uVar23];
        if (paVar1 != (aiMesh *)0x0) {
          uVar19 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          pScene->mMeshes[uVar19] = paVar1;
        }
        uVar23 = uVar23 + 1;
      } while (uVar7 < uVar15);
      UpdateMeshIndices(pScene->mRootNode,lookup);
      bVar6 = DefaultLogger::isNullLogger();
      if (!bVar6) {
        pLVar9 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[38]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [38])"FindInstancesProcess finished. Found ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," instances",10);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar9,(char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      pScene->mNumMeshes = uVar15;
    }
    operator_delete__(lookup);
    operator_delete__(pvVar10);
  }
  return;
code_r0x003bd5aa:
  uVar12 = uVar12 + 1;
  if (uVar12 == 8) goto code_r0x003bd5b3;
  goto LAB_003bd5a2;
code_r0x003bd5b3:
  uVar12 = 8;
LAB_003bd5c3:
  iVar8 = (int)uVar12;
  uVar14 = 0;
  do {
    paVar2 = orig->mTextureCoords[uVar14];
    if ((paVar2 != (aiVector3D *)0x0) && (uVar13 != 0)) {
      paVar3 = paVar1->mTextureCoords[uVar14];
      lVar17 = 0;
      do {
        fVar28 = *(float *)((long)&paVar2->x + lVar17) - *(float *)((long)&paVar3->x + lVar17);
        fVar26 = *(float *)((long)&paVar2->y + lVar17) - *(float *)((long)&paVar3->y + lVar17);
        fVar27 = *(float *)((long)&paVar2->z + lVar17) - *(float *)((long)&paVar3->z + lVar17);
        if (0.001 <= fVar27 * fVar27 + fVar28 * fVar28 + fVar26 * fVar26) goto LAB_003bd64a;
        paVar18 = (aiVector3D *)((long)&paVar2[1].x + lVar17);
        lVar17 = lVar17 + 0xc;
      } while (paVar18 != paVar2 + uVar13);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != (uVar12 & 0xffffffff));
LAB_003bd652:
  uVar12 = 0;
LAB_003bd654:
  if (orig->mColors[uVar12] != (aiColor4D *)0x0) goto code_r0x003bd65c;
  if (uVar12 == 0) {
    iVar8 = 0;
    uVar14 = 0;
LAB_003bd719:
    if ((int)uVar14 == iVar8) goto LAB_003bd721;
    goto LAB_003bd810;
  }
  goto LAB_003bd675;
code_r0x003bd65c:
  uVar12 = uVar12 + 1;
  if (uVar12 == 8) goto code_r0x003bd665;
  goto LAB_003bd654;
code_r0x003bd665:
  uVar12 = 8;
LAB_003bd675:
  iVar8 = (int)uVar12;
  uVar14 = 0;
  do {
    paVar4 = orig->mColors[uVar14];
    if ((paVar4 != (aiColor4D *)0x0) && (uVar13 != 0)) {
      paVar5 = paVar1->mColors[uVar14];
      lVar17 = 0;
      do {
        fVar29 = *(float *)((long)&paVar4->r + lVar17) - *(float *)((long)&paVar5->r + lVar17);
        fVar26 = *(float *)((long)&paVar4->g + lVar17) - *(float *)((long)&paVar5->g + lVar17);
        fVar27 = *(float *)((long)&paVar4->b + lVar17) - *(float *)((long)&paVar5->b + lVar17);
        fVar28 = *(float *)((long)&paVar4->a + lVar17) - *(float *)((long)&paVar5->a + lVar17);
        if (0.001 <= fVar28 * fVar28 + fVar27 * fVar27 + fVar29 * fVar29 + fVar26 * fVar26)
        goto LAB_003bd719;
        paVar21 = (aiColor4D *)((long)&paVar4[1].r + lVar17);
        lVar17 = lVar17 + 0x10;
      } while (paVar21 != paVar4 + uVar13);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != (uVar12 & 0xffffffff));
LAB_003bd721:
  if (this->configSpeedFlag != false) {
LAB_003bd859:
    lookup[uVar19] = lookup[uVar22];
    aiMesh::~aiMesh(paVar1);
    operator_delete(paVar1,0x520);
    pScene->mMeshes[uVar19] = (aiMesh *)0x0;
    goto LAB_003bd81e;
  }
  bVar6 = CompareBones(orig,paVar1);
  if (bVar6) {
    __s2 = operator_new__(uVar13 << 2);
    __s1 = operator_new__((ulong)orig->mNumVertices << 2);
    if (orig->mNumFaces != 0) {
      uVar13 = 0;
      do {
        if (orig->mFaces[uVar13].mNumIndices != 0) {
          paVar16 = orig->mFaces + uVar13;
          uVar12 = 0;
          do {
            *(int *)((long)__s2 + (ulong)paVar16->mIndices[uVar12] * 4) = (int)uVar13;
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar16->mNumIndices);
        }
        if (paVar1->mFaces[uVar13].mNumIndices != 0) {
          paVar16 = paVar1->mFaces + uVar13;
          uVar12 = 0;
          do {
            *(int *)((long)__s1 + (ulong)paVar16->mIndices[uVar12] * 4) = (int)uVar13;
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar16->mNumIndices);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < orig->mNumFaces);
    }
    iVar8 = bcmp(__s1,__s2,(ulong)orig->mNumVertices << 2);
    operator_delete__(__s1);
    operator_delete__(__s2);
    if (iVar8 == 0) goto LAB_003bd859;
  }
LAB_003bd810:
  bVar6 = (int)uVar7 < 1;
  uVar7 = uVar7 - 1;
  if (bVar6) goto LAB_003bd81e;
  goto LAB_003bd365;
}

Assistant:

void FindInstancesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FindInstancesProcess begin");
    if (pScene->mNumMeshes) {

        // use a pseudo hash for all meshes in the scene to quickly find
        // the ones which are possibly equal. This step is executed early
        // in the pipeline, so we could, depending on the file format,
        // have several thousand small meshes. That's too much for a brute
        // everyone-against-everyone check involving up to 10 comparisons
        // each.
        std::unique_ptr<uint64_t[]> hashes (new uint64_t[pScene->mNumMeshes]);
        std::unique_ptr<unsigned int[]> remapping (new unsigned int[pScene->mNumMeshes]);

        unsigned int numMeshesOut = 0;
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

            aiMesh* inst = pScene->mMeshes[i];
            hashes[i] = GetMeshHash(inst);

            // Find an appropriate epsilon 
            // to compare position differences against
            float epsilon = ComputePositionEpsilon(inst);
            epsilon *= epsilon;

            for (int a = i-1; a >= 0; --a) {
                if (hashes[i] == hashes[a])
                {
                    aiMesh* orig = pScene->mMeshes[a];
                    if (!orig)
                        continue;

                    // check for hash collision .. we needn't check
                    // the vertex format, it *must* match due to the
                    // (brilliant) construction of the hash
                    if (orig->mNumBones       != inst->mNumBones      ||
                        orig->mNumFaces       != inst->mNumFaces      ||
                        orig->mNumVertices    != inst->mNumVertices   ||
                        orig->mMaterialIndex  != inst->mMaterialIndex ||
                        orig->mPrimitiveTypes != inst->mPrimitiveTypes)
                        continue;

                    // up to now the meshes are equal. Now compare vertex positions, normals,
                    // tangents and bitangents using this epsilon.
                    if (orig->HasPositions()) {
                        if(!CompareArrays(orig->mVertices,inst->mVertices,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasNormals()) {
                        if(!CompareArrays(orig->mNormals,inst->mNormals,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasTangentsAndBitangents()) {
                        if (!CompareArrays(orig->mTangents,inst->mTangents,orig->mNumVertices,epsilon) ||
                            !CompareArrays(orig->mBitangents,inst->mBitangents,orig->mNumVertices,epsilon))
                            continue;
                    }

                    // use a constant epsilon for colors and UV coordinates
                    static const float uvEpsilon = 10e-4f;
                    {
                        unsigned int j, end = orig->GetNumUVChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mTextureCoords[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mTextureCoords[j],inst->mTextureCoords[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }
                    {
                        unsigned int j, end = orig->GetNumColorChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mColors[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mColors[j],inst->mColors[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }

                    // These two checks are actually quite expensive and almost *never* required.
                    // Almost. That's why they're still here. But there's no reason to do them
                    // in speed-targeted imports.
                    if (!configSpeedFlag) {

                        // It seems to be strange, but we really need to check whether the
                        // bones are identical too. Although it's extremely unprobable
                        // that they're not if control reaches here, we need to deal
                        // with unprobable cases, too. It could still be that there are
                        // equal shapes which are deformed differently.
                        if (!CompareBones(orig,inst))
                            continue;

                        // For completeness ... compare even the index buffers for equality
                        // face order & winding order doesn't care. Input data is in verbose format.
                        std::unique_ptr<unsigned int[]> ftbl_orig(new unsigned int[orig->mNumVertices]);
                        std::unique_ptr<unsigned int[]> ftbl_inst(new unsigned int[orig->mNumVertices]);

                        for (unsigned int tt = 0; tt < orig->mNumFaces;++tt) {
                            aiFace& f = orig->mFaces[tt];
                            for (unsigned int nn = 0; nn < f.mNumIndices;++nn)
                                ftbl_orig[f.mIndices[nn]] = tt;

                            aiFace& f2 = inst->mFaces[tt];
                            for (unsigned int nn = 0; nn < f2.mNumIndices;++nn)
                                ftbl_inst[f2.mIndices[nn]] = tt;
                        }
                        if (0 != ::memcmp(ftbl_inst.get(),ftbl_orig.get(),orig->mNumVertices*sizeof(unsigned int)))
                            continue;
                    }

                    // We're still here. Or in other words: 'inst' is an instance of 'orig'.
                    // Place a marker in our list that we can easily update mesh indices.
                    remapping[i] = remapping[a];

                    // Delete the instanced mesh, we don't need it anymore
                    delete inst;
                    pScene->mMeshes[i] = NULL;
                    break;
                }
            }

            // If we didn't find a match for the current mesh: keep it
            if (pScene->mMeshes[i]) {
                remapping[i] = numMeshesOut++;
            }
        }
        ai_assert(0 != numMeshesOut);
        if (numMeshesOut != pScene->mNumMeshes) {

            // Collapse the meshes array by removing all NULL entries
            for (unsigned int real = 0, i = 0; real < numMeshesOut; ++i) {
                if (pScene->mMeshes[i])
                    pScene->mMeshes[real++] = pScene->mMeshes[i];
            }

            // And update the node graph with our nice lookup table
            UpdateMeshIndices(pScene->mRootNode,remapping.get());

            // write to log
            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_INFO_F( "FindInstancesProcess finished. Found ", (pScene->mNumMeshes - numMeshesOut), " instances" );
            }
            pScene->mNumMeshes = numMeshesOut;
        } else {
            ASSIMP_LOG_DEBUG("FindInstancesProcess finished. No instanced meshes found");
        }
    }
}